

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue2f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y)

{
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [2];
  TestLog *this;
  MessageBuilder *pMVar4;
  MessageBuilder local_1c0;
  undefined1 local_40 [8];
  StateQueryMemoryWriteGuard<float[2]> state;
  float y_local;
  float x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[0] = y;
  state.m_postguard[1] = x;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[2]> *)local_40);
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_40);
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[2]> *)local_40,testCtx);
  if (bVar1) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_40);
    if (((*pafVar3)[0] == state.m_postguard[1]) &&
       (!NAN((*pafVar3)[0]) && !NAN(state.m_postguard[1]))) {
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_40);
      if (((*pafVar3)[1] == state.m_postguard[0]) &&
         (!NAN((*pafVar3)[1]) && !NAN(state.m_postguard[0]))) {
        return;
      }
    }
    this = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [21])"// ERROR: expected [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x12ed2ef);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x12ed2ef);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x12a9f4e);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue2f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[2]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y
		<< "]; got ["
		<< state[0] << ", "
		<< state[1]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}